

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

Script * cfd::GetLockingScriptFromUtxoData(Script *__return_storage_ptr__,UtxoData *utxo)

{
  Script *extraout_RAX;
  Script *extraout_RAX_00;
  Script *extraout_RAX_01;
  Script *pSVar1;
  Descriptor desc;
  Script SStack_1c8;
  undefined1 local_190 [368];
  
  core::Script::Script(__return_storage_ptr__,&utxo->locking_script);
  core::Address::GetAddress_abi_cxx11_((string *)local_190,&utxo->address);
  pSVar1 = (Script *)(local_190 + 0x10);
  if ((Script *)local_190._0_8_ != pSVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    pSVar1 = extraout_RAX;
  }
  if ((pointer)local_190._8_8_ == (pointer)0x0) {
    if ((utxo->descriptor)._M_string_length != 0) {
      core::Descriptor::Parse
                ((Descriptor *)local_190,&utxo->descriptor,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0,kMainnet);
      core::Descriptor::GetLockingScript(&SStack_1c8,(Descriptor *)local_190);
      core::Script::operator=(__return_storage_ptr__,&SStack_1c8);
      core::Script::~Script(&SStack_1c8);
      core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_190);
      pSVar1 = extraout_RAX_01;
    }
  }
  else {
    core::Address::GetLockingScript((Script *)local_190,&utxo->address);
    core::Script::operator=(__return_storage_ptr__,(Script *)local_190);
    core::Script::~Script((Script *)local_190);
    pSVar1 = extraout_RAX_00;
  }
  return pSVar1;
}

Assistant:

static Script GetLockingScriptFromUtxoData(const UtxoData& utxo) {
  Script locking_script = utxo.locking_script;
  if (!utxo.address.GetAddress().empty()) {
    locking_script = utxo.address.GetLockingScript();
  } else if (!utxo.descriptor.empty()) {
    auto desc = Descriptor::Parse(utxo.descriptor);
    locking_script = desc.GetLockingScript();
  }
  return locking_script;
}